

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

bool testing::TestSuite::TestPassed(TestInfo *test_info)

{
  bool bVar1;
  
  if (test_info->should_run_ == true) {
    bVar1 = TestResult::Passed(&test_info->result_);
    return bVar1;
  }
  return false;
}

Assistant:

static bool TestPassed(const TestInfo* test_info) {
    return test_info->should_run() && test_info->result()->Passed();
  }